

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

double duckdb::Log10Operator::Operation<double,double>(double input)

{
  OutOfRangeException *pOVar1;
  double in_XMM0_Qa;
  double dVar2;
  allocator local_61;
  string local_60 [35];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  if (in_XMM0_Qa < 0.0) {
    local_3d = 1;
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"cannot take logarithm of a negative number",&local_29);
    duckdb::OutOfRangeException::OutOfRangeException(pOVar1,local_28);
    local_3d = 0;
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"cannot take logarithm of zero",&local_61);
    duckdb::OutOfRangeException::OutOfRangeException(pOVar1,local_60);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  dVar2 = log10(in_XMM0_Qa);
  return dVar2;
}

Assistant:

static inline TR Operation(TA input) {
		if (input < 0) {
			throw OutOfRangeException("cannot take logarithm of a negative number");
		}
		if (input == 0) {
			throw OutOfRangeException("cannot take logarithm of zero");
		}
		return std::log10(input);
	}